

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O3

int test_5_3_1::del_hash(int *h,int k,int n)

{
  int iVar1;
  int iVar2;
  _Alloc_hider _Var3;
  string local_58;
  string local_38;
  
  iVar1 = k % 7;
  if (h[iVar1] == k) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,anon_var_dwarf_2442,anon_var_dwarf_2442 + 0xc);
    iVar1 = 1;
    errCode(&local_38,1);
    local_58.field_2._M_allocated_capacity = local_38.field_2._M_allocated_capacity;
    _Var3._M_p = local_38._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return 1;
    }
  }
  else {
    if (1 < n) {
      iVar2 = n + -1;
      do {
        iVar1 = iVar1 + 1;
        if (h[iVar1 % 7] == k) {
          h[iVar1 % 7] = -1;
          return 1;
        }
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,anon_var_dwarf_2437,anon_var_dwarf_2437 + 0x15);
    iVar1 = 0;
    errCode(&local_58,0);
    _Var3._M_p = local_58._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p == &local_58.field_2) {
      return 0;
    }
  }
  operator_delete(_Var3._M_p,local_58.field_2._M_allocated_capacity + 1);
  return iVar1;
}

Assistant:

int del_hash(int *h, int k, int n) {
        int i = k % 7;
        if (h[i] == INTMAX_MAX)
            return errCode("没有这个关键字", 0);
        if (h[i] == k) {
            h[i] == INTMAX_MAX;
            return errCode("删除成功", 1);
        } else {
            int j = i;
            for (int d = 1; d <= n - 1; d++) {
                i = (j + d) % 7;
                if (h[i] == INTMAX_MAX)
                    return 0;
                if (h[i] == k) {
                    h[i] = INTMAX_MAX;
                    return 1;
                }
            }
            return errCode("没有这个关键字", 0);
        }
    }